

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fr.h
# Opt level: O0

void __thiscall FR<8U>::FR(FR<8U> *this,int num,int _HIT)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  undefined4 in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  uint in_stack_ffffffffffffff9c;
  Abstract<8U> *in_stack_ffffffffffffffa0;
  void *local_50;
  
  Abstract<8U>::Abstract(in_stack_ffffffffffffffa0);
  *in_RDI = &PTR_Init_00121ad8;
  *(undefined4 *)(in_RDI + 0xd) = in_EDX;
  *(int *)(in_RDI + 0x11) = in_ESI / 0x11;
  *(int *)((long)in_RDI + 0x84) = *(int *)(in_RDI + 0x11) << 3;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  pvVar2 = operator_new(0x10);
  BitSet::BitSet((BitSet *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  in_RDI[0xe] = pvVar2;
  uVar3 = (ulong)*(int *)(in_RDI + 0x11);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar2 = operator_new__(uVar4);
  if (uVar3 != 0) {
    local_50 = pvVar2;
    do {
      Counter::Counter((Counter *)0x110d4f);
      local_50 = (void *)((long)local_50 + 0x10);
    } while (local_50 != (void *)((long)pvVar2 + uVar3 * 0x10));
  }
  in_RDI[0xf] = pvVar2;
  memset((void *)in_RDI[0xf],0,(long)*(int *)(in_RDI + 0x11) << 4);
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"FR");
  std::__cxx11::string::operator=((string *)(in_RDI + 9),"\t\t\t");
  return;
}

Assistant:

FR(int num, int _HIT) {
		this->HIT = _HIT;
		SIZE = num / 17;
		// SIZE = 118750 + 30000 * (num - 1);
		LENGTH = 8 * SIZE;
		// LENGTH = 800000 + 160000 * (num - 1);
		flow = 0;
		bitset = new BitSet(LENGTH);
		counter = new Counter[SIZE];
		memset(counter, 0, sizeof(Counter) * SIZE);
		this->name = "FR";
		this->sep = "\t\t\t";
	}